

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AS_DCP_JP2K.cpp
# Opt level: O0

ASDCP * __thiscall
ASDCP::MD_to_JP2K_PDesc
          (ASDCP *this,GenericPictureEssenceDescriptor *EssenceDescriptor,
          JPEG2000PictureSubDescriptor *EssenceSubDescriptor,Rational *EditRate,Rational *SampleRate
          ,PictureDescriptor *PDesc)

{
  bool bVar1;
  ui32_t uVar2;
  unsigned_long_long *puVar3;
  ByteString *pBVar4;
  ImageComponent_t *__dest;
  byte_t *pbVar5;
  ILogSink *this_00;
  CodingStyleDefault_t *__dest_00;
  QuantizationDefault_t *__dest_01;
  Array<Kumu::ArchivableUi16> *pAVar6;
  size_type sVar7;
  J2KExtendedCapabilitiesType *pJVar8;
  const_iterator __first;
  const_iterator __last;
  int local_6c;
  ArchivableUi16 *local_68;
  __normal_iterator<const_Kumu::ArchivableUi16_*,_std::vector<Kumu::ArchivableUi16,_std::allocator<Kumu::ArchivableUi16>_>_>
  local_60;
  int local_54;
  ArchivableUi16 *local_50;
  __normal_iterator<const_Kumu::ArchivableUi16_*,_std::vector<Kumu::ArchivableUi16,_std::allocator<Kumu::ArchivableUi16>_>_>
  local_48;
  int local_40;
  ui32_t local_3c;
  PictureDescriptor *pPStack_38;
  ui32_t tmp_size;
  PictureDescriptor *PDesc_local;
  Rational *SampleRate_local;
  Rational *EditRate_local;
  JPEG2000PictureSubDescriptor *EssenceSubDescriptor_local;
  GenericPictureEssenceDescriptor *EssenceDescriptor_local;
  
  pPStack_38 = PDesc;
  PDesc_local = (PictureDescriptor *)SampleRate;
  SampleRate_local = EditRate;
  EditRate_local = (Rational *)EssenceSubDescriptor;
  EssenceSubDescriptor_local = (JPEG2000PictureSubDescriptor *)EssenceDescriptor;
  EssenceDescriptor_local = (GenericPictureEssenceDescriptor *)this;
  memset(PDesc,0,0x1d8);
  pPStack_38->EditRate = *SampleRate_local;
  pPStack_38->SampleRate = PDesc_local->EditRate;
  bVar1 = MXF::optional_property<unsigned_long_long>::empty
                    ((optional_property<unsigned_long_long> *)
                     &(EssenceSubDescriptor_local->CodingStyleDefault).m_property.field_0x10);
  if (!bVar1) {
    puVar3 = MXF::optional_property<unsigned_long_long>::const_get
                       ((optional_property<unsigned_long_long> *)
                        &(EssenceSubDescriptor_local->CodingStyleDefault).m_property.field_0x10);
    if (0xffffffff < *puVar3) {
      __assert_fail("EssenceDescriptor.ContainerDuration.const_get() <= 0xFFFFFFFFL",
                    "/workspace/llm4binary/github/license_c_cmakelists/cinecert[P]asdcplib/src/AS_DCP_JP2K.cpp"
                    ,0x194,
                    "ASDCP::Result_t ASDCP::MD_to_JP2K_PDesc(const ASDCP::MXF::GenericPictureEssenceDescriptor &, const ASDCP::MXF::JPEG2000PictureSubDescriptor &, const ASDCP::Rational &, const ASDCP::Rational &, ASDCP::JP2K::PictureDescriptor &)"
                   );
    }
    puVar3 = MXF::optional_property<unsigned_long_long>::const_get
                       ((optional_property<unsigned_long_long> *)
                        &(EssenceSubDescriptor_local->CodingStyleDefault).m_property.field_0x10);
    pPStack_38->ContainerDuration = (ui32_t)*puVar3;
  }
  pPStack_38->StoredWidth =
       *(ui32_t *)&(EssenceSubDescriptor_local->J2KExtendedCapabilities).m_property.field_0xc;
  pPStack_38->StoredHeight =
       *(ui32_t *)
        &(EssenceSubDescriptor_local->J2KExtendedCapabilities).m_property.Ccap.
         super_FixedSizeItemCollection<std::vector<Kumu::ArchivableUi16,_std::allocator<Kumu::ArchivableUi16>_>_>
         .super_IArchive._vptr_IArchive;
  pPStack_38->AspectRatio =
       *(Rational *)
        ((long)&(EssenceSubDescriptor_local->J2KCorrespondingProfile).m_property.
                super_FixedSizeItemCollection<std::vector<Kumu::ArchivableUi16,_std::allocator<Kumu::ArchivableUi16>_>_>
                .super_vector<Kumu::ArchivableUi16,_std::allocator<Kumu::ArchivableUi16>_>.
                super__Vector_base<Kumu::ArchivableUi16,_std::allocator<Kumu::ArchivableUi16>_>.
                _M_impl.super__Vector_impl_data + 8);
  pPStack_38->Rsize = (ui16_t)EditRate_local[0x14].Numerator;
  pPStack_38->Xsize = EditRate_local[0x14].Denominator;
  pPStack_38->Ysize = EditRate_local[0x15].Numerator;
  pPStack_38->XOsize = EditRate_local[0x15].Denominator;
  pPStack_38->YOsize = EditRate_local[0x16].Numerator;
  pPStack_38->XTsize = EditRate_local[0x16].Denominator;
  pPStack_38->YTsize = EditRate_local[0x17].Numerator;
  pPStack_38->XTOsize = EditRate_local[0x17].Denominator;
  pPStack_38->YTOsize = EditRate_local[0x18].Numerator;
  pPStack_38->Csize = (ui16_t)EditRate_local[0x18].Denominator;
  pBVar4 = &MXF::optional_property<ASDCP::MXF::Raw>::const_get
                      ((optional_property<ASDCP::MXF::Raw> *)(EditRate_local + 0x19))->
            super_ByteString;
  local_3c = Kumu::ByteString::Length(pBVar4);
  if (local_3c == 0x11) {
    __dest = pPStack_38->ImageComponents;
    pBVar4 = &MXF::optional_property<ASDCP::MXF::Raw>::const_get
                        ((optional_property<ASDCP::MXF::Raw> *)(EditRate_local + 0x19))->
              super_ByteString;
    pbVar5 = Kumu::ByteString::RoData(pBVar4);
    memcpy(__dest,pbVar5 + 8,(ulong)(local_3c - 8));
  }
  else {
    this_00 = (ILogSink *)Kumu::DefaultLogSink();
    Kumu::ILogSink::Warn
              (this_00,"Unexpected PictureComponentSizing size: %u, should be 17.\n",(ulong)local_3c
              );
  }
  memset(&pPStack_38->CodingStyleDefault,0,0x2a);
  __dest_00 = &pPStack_38->CodingStyleDefault;
  pBVar4 = &MXF::optional_property<ASDCP::MXF::Raw>::const_get
                      ((optional_property<ASDCP::MXF::Raw> *)(EditRate_local + 0x1d))->
            super_ByteString;
  pbVar5 = Kumu::ByteString::RoData(pBVar4);
  pBVar4 = &MXF::optional_property<ASDCP::MXF::Raw>::const_get
                      ((optional_property<ASDCP::MXF::Raw> *)(EditRate_local + 0x1d))->
            super_ByteString;
  uVar2 = Kumu::ByteString::Length(pBVar4);
  memcpy(__dest_00,pbVar5,(ulong)uVar2);
  memset(&pPStack_38->QuantizationDefault,0,0x102);
  __dest_01 = &pPStack_38->QuantizationDefault;
  pBVar4 = &MXF::optional_property<ASDCP::MXF::Raw>::const_get
                      ((optional_property<ASDCP::MXF::Raw> *)(EditRate_local + 0x21))->
            super_ByteString;
  pbVar5 = Kumu::ByteString::RoData(pBVar4);
  pBVar4 = &MXF::optional_property<ASDCP::MXF::Raw>::const_get
                      ((optional_property<ASDCP::MXF::Raw> *)(EditRate_local + 0x21))->
            super_ByteString;
  uVar2 = Kumu::ByteString::Length(pBVar4);
  memcpy(__dest_01,pbVar5,(ulong)uVar2);
  pBVar4 = &MXF::optional_property<ASDCP::MXF::Raw>::const_get
                      ((optional_property<ASDCP::MXF::Raw> *)(EditRate_local + 0x21))->
            super_ByteString;
  uVar2 = Kumu::ByteString::Length(pBVar4);
  (pPStack_38->QuantizationDefault).SPqcdLength = (char)uVar2 + 0xff;
  local_40 = 0;
  std::fill<unsigned_short*,int>
            ((pPStack_38->Profile).Pprf,&(pPStack_38->CorrespondingProfile).N,&local_40);
  bVar1 = MXF::optional_property<ASDCP::MXF::Array<Kumu::ArchivableUi16>_>::empty
                    ((optional_property<ASDCP::MXF::Array<Kumu::ArchivableUi16>_> *)
                     (EditRate_local + 0x30));
  if (bVar1) {
LAB_002aacfd:
    (pPStack_38->Profile).N = 0;
  }
  else {
    pAVar6 = MXF::optional_property<ASDCP::MXF::Array<Kumu::ArchivableUi16>_>::const_get
                       ((optional_property<ASDCP::MXF::Array<Kumu::ArchivableUi16>_> *)
                        (EditRate_local + 0x30));
    sVar7 = std::vector<Kumu::ArchivableUi16,_std::allocator<Kumu::ArchivableUi16>_>::size
                      (&(pAVar6->
                        super_FixedSizeItemCollection<std::vector<Kumu::ArchivableUi16,_std::allocator<Kumu::ArchivableUi16>_>_>
                        ).super_vector<Kumu::ArchivableUi16,_std::allocator<Kumu::ArchivableUi16>_>)
    ;
    if (sVar7 == 0) goto LAB_002aacfd;
    pAVar6 = MXF::optional_property<ASDCP::MXF::Array<Kumu::ArchivableUi16>_>::const_get
                       ((optional_property<ASDCP::MXF::Array<Kumu::ArchivableUi16>_> *)
                        (EditRate_local + 0x30));
    sVar7 = std::vector<Kumu::ArchivableUi16,_std::allocator<Kumu::ArchivableUi16>_>::size
                      (&(pAVar6->
                        super_FixedSizeItemCollection<std::vector<Kumu::ArchivableUi16,_std::allocator<Kumu::ArchivableUi16>_>_>
                        ).super_vector<Kumu::ArchivableUi16,_std::allocator<Kumu::ArchivableUi16>_>)
    ;
    (pPStack_38->Profile).N = (ui16_t)sVar7;
    pAVar6 = MXF::optional_property<ASDCP::MXF::Array<Kumu::ArchivableUi16>_>::const_get
                       ((optional_property<ASDCP::MXF::Array<Kumu::ArchivableUi16>_> *)
                        (EditRate_local + 0x30));
    local_48._M_current =
         (ArchivableUi16 *)
         std::vector<Kumu::ArchivableUi16,_std::allocator<Kumu::ArchivableUi16>_>::begin
                   (&(pAVar6->
                     super_FixedSizeItemCollection<std::vector<Kumu::ArchivableUi16,_std::allocator<Kumu::ArchivableUi16>_>_>
                     ).super_vector<Kumu::ArchivableUi16,_std::allocator<Kumu::ArchivableUi16>_>);
    pAVar6 = MXF::optional_property<ASDCP::MXF::Array<Kumu::ArchivableUi16>_>::const_get
                       ((optional_property<ASDCP::MXF::Array<Kumu::ArchivableUi16>_> *)
                        (EditRate_local + 0x30));
    local_50 = (ArchivableUi16 *)
               std::vector<Kumu::ArchivableUi16,_std::allocator<Kumu::ArchivableUi16>_>::end
                         (&(pAVar6->
                           super_FixedSizeItemCollection<std::vector<Kumu::ArchivableUi16,_std::allocator<Kumu::ArchivableUi16>_>_>
                           ).
                           super_vector<Kumu::ArchivableUi16,_std::allocator<Kumu::ArchivableUi16>_>
                         );
    std::
    copy<__gnu_cxx::__normal_iterator<Kumu::ArchivableUi16_const*,std::vector<Kumu::ArchivableUi16,std::allocator<Kumu::ArchivableUi16>>>,unsigned_short*>
              (local_48,(__normal_iterator<const_Kumu::ArchivableUi16_*,_std::vector<Kumu::ArchivableUi16,_std::allocator<Kumu::ArchivableUi16>_>_>
                         )local_50,(pPStack_38->Profile).Pprf);
  }
  local_54 = 0;
  std::fill<unsigned_short*,int>
            ((pPStack_38->CorrespondingProfile).Pcpf,(unsigned_short *)(pPStack_38 + 1),&local_54);
  bVar1 = MXF::optional_property<ASDCP::MXF::Array<Kumu::ArchivableUi16>_>::empty
                    ((optional_property<ASDCP::MXF::Array<Kumu::ArchivableUi16>_> *)
                     (EditRate_local + 0x35));
  if (!bVar1) {
    pAVar6 = MXF::optional_property<ASDCP::MXF::Array<Kumu::ArchivableUi16>_>::const_get
                       ((optional_property<ASDCP::MXF::Array<Kumu::ArchivableUi16>_> *)
                        (EditRate_local + 0x35));
    sVar7 = std::vector<Kumu::ArchivableUi16,_std::allocator<Kumu::ArchivableUi16>_>::size
                      (&(pAVar6->
                        super_FixedSizeItemCollection<std::vector<Kumu::ArchivableUi16,_std::allocator<Kumu::ArchivableUi16>_>_>
                        ).super_vector<Kumu::ArchivableUi16,_std::allocator<Kumu::ArchivableUi16>_>)
    ;
    if (sVar7 != 0) {
      pAVar6 = MXF::optional_property<ASDCP::MXF::Array<Kumu::ArchivableUi16>_>::const_get
                         ((optional_property<ASDCP::MXF::Array<Kumu::ArchivableUi16>_> *)
                          (EditRate_local + 0x35));
      sVar7 = std::vector<Kumu::ArchivableUi16,_std::allocator<Kumu::ArchivableUi16>_>::size
                        (&(pAVar6->
                          super_FixedSizeItemCollection<std::vector<Kumu::ArchivableUi16,_std::allocator<Kumu::ArchivableUi16>_>_>
                          ).
                          super_vector<Kumu::ArchivableUi16,_std::allocator<Kumu::ArchivableUi16>_>)
      ;
      (pPStack_38->CorrespondingProfile).N = (ui16_t)sVar7;
      pAVar6 = MXF::optional_property<ASDCP::MXF::Array<Kumu::ArchivableUi16>_>::const_get
                         ((optional_property<ASDCP::MXF::Array<Kumu::ArchivableUi16>_> *)
                          (EditRate_local + 0x35));
      local_60._M_current =
           (ArchivableUi16 *)
           std::vector<Kumu::ArchivableUi16,_std::allocator<Kumu::ArchivableUi16>_>::begin
                     (&(pAVar6->
                       super_FixedSizeItemCollection<std::vector<Kumu::ArchivableUi16,_std::allocator<Kumu::ArchivableUi16>_>_>
                       ).super_vector<Kumu::ArchivableUi16,_std::allocator<Kumu::ArchivableUi16>_>);
      pAVar6 = MXF::optional_property<ASDCP::MXF::Array<Kumu::ArchivableUi16>_>::const_get
                         ((optional_property<ASDCP::MXF::Array<Kumu::ArchivableUi16>_> *)
                          (EditRate_local + 0x35));
      local_68 = (ArchivableUi16 *)
                 std::vector<Kumu::ArchivableUi16,_std::allocator<Kumu::ArchivableUi16>_>::end
                           (&(pAVar6->
                             super_FixedSizeItemCollection<std::vector<Kumu::ArchivableUi16,_std::allocator<Kumu::ArchivableUi16>_>_>
                             ).
                             super_vector<Kumu::ArchivableUi16,_std::allocator<Kumu::ArchivableUi16>_>
                           );
      std::
      copy<__gnu_cxx::__normal_iterator<Kumu::ArchivableUi16_const*,std::vector<Kumu::ArchivableUi16,std::allocator<Kumu::ArchivableUi16>>>,unsigned_short*>
                (local_60,(__normal_iterator<const_Kumu::ArchivableUi16_*,_std::vector<Kumu::ArchivableUi16,_std::allocator<Kumu::ArchivableUi16>_>_>
                           )local_68,(pPStack_38->CorrespondingProfile).Pcpf);
      goto LAB_002aae95;
    }
  }
  (pPStack_38->CorrespondingProfile).N = 0;
LAB_002aae95:
  local_6c = 0;
  std::fill<unsigned_short*,int>
            ((pPStack_38->ExtendedCapabilities).Ccap,&(pPStack_38->Profile).N,&local_6c);
  bVar1 = MXF::optional_property<ASDCP::MXF::J2KExtendedCapabilitiesType>::empty
                    ((optional_property<ASDCP::MXF::J2KExtendedCapabilitiesType> *)
                     (EditRate_local + 0x29));
  if (bVar1) {
    (pPStack_38->ExtendedCapabilities).Pcap = 0;
    (pPStack_38->ExtendedCapabilities).N = -1;
  }
  else {
    pJVar8 = MXF::optional_property<ASDCP::MXF::J2KExtendedCapabilitiesType>::const_get
                       ((optional_property<ASDCP::MXF::J2KExtendedCapabilitiesType> *)
                        (EditRate_local + 0x29));
    (pPStack_38->ExtendedCapabilities).Pcap = pJVar8->Pcap;
    pJVar8 = MXF::optional_property<ASDCP::MXF::J2KExtendedCapabilitiesType>::const_get
                       ((optional_property<ASDCP::MXF::J2KExtendedCapabilitiesType> *)
                        (EditRate_local + 0x29));
    sVar7 = std::vector<Kumu::ArchivableUi16,_std::allocator<Kumu::ArchivableUi16>_>::size
                      (&(pJVar8->Ccap).
                        super_FixedSizeItemCollection<std::vector<Kumu::ArchivableUi16,_std::allocator<Kumu::ArchivableUi16>_>_>
                        .super_vector<Kumu::ArchivableUi16,_std::allocator<Kumu::ArchivableUi16>_>);
    (pPStack_38->ExtendedCapabilities).N = (i8_t)sVar7;
    pJVar8 = MXF::optional_property<ASDCP::MXF::J2KExtendedCapabilitiesType>::const_get
                       ((optional_property<ASDCP::MXF::J2KExtendedCapabilitiesType> *)
                        (EditRate_local + 0x29));
    __first = std::vector<Kumu::ArchivableUi16,_std::allocator<Kumu::ArchivableUi16>_>::begin
                        (&(pJVar8->Ccap).
                          super_FixedSizeItemCollection<std::vector<Kumu::ArchivableUi16,_std::allocator<Kumu::ArchivableUi16>_>_>
                          .super_vector<Kumu::ArchivableUi16,_std::allocator<Kumu::ArchivableUi16>_>
                        );
    pJVar8 = MXF::optional_property<ASDCP::MXF::J2KExtendedCapabilitiesType>::const_get
                       ((optional_property<ASDCP::MXF::J2KExtendedCapabilitiesType> *)
                        (EditRate_local + 0x29));
    __last = std::vector<Kumu::ArchivableUi16,_std::allocator<Kumu::ArchivableUi16>_>::end
                       (&(pJVar8->Ccap).
                         super_FixedSizeItemCollection<std::vector<Kumu::ArchivableUi16,_std::allocator<Kumu::ArchivableUi16>_>_>
                         .super_vector<Kumu::ArchivableUi16,_std::allocator<Kumu::ArchivableUi16>_>)
    ;
    std::
    copy<__gnu_cxx::__normal_iterator<Kumu::ArchivableUi16_const*,std::vector<Kumu::ArchivableUi16,std::allocator<Kumu::ArchivableUi16>>>,unsigned_short*>
              ((__normal_iterator<const_Kumu::ArchivableUi16_*,_std::vector<Kumu::ArchivableUi16,_std::allocator<Kumu::ArchivableUi16>_>_>
                )__first._M_current,
               (__normal_iterator<const_Kumu::ArchivableUi16_*,_std::vector<Kumu::ArchivableUi16,_std::allocator<Kumu::ArchivableUi16>_>_>
                )__last._M_current,(pPStack_38->ExtendedCapabilities).Ccap);
  }
  Kumu::Result_t::Result_t((Result_t *)this,(Result_t *)Kumu::RESULT_OK);
  return this;
}

Assistant:

ASDCP::Result_t
ASDCP::MD_to_JP2K_PDesc(const ASDCP::MXF::GenericPictureEssenceDescriptor&  EssenceDescriptor,
			const ASDCP::MXF::JPEG2000PictureSubDescriptor& EssenceSubDescriptor,
			const ASDCP::Rational& EditRate, const ASDCP::Rational& SampleRate,
			ASDCP::JP2K::PictureDescriptor& PDesc)
{
  memset(&PDesc, 0, sizeof(PDesc));

  PDesc.EditRate           = EditRate;
  PDesc.SampleRate         = SampleRate;
  if ( ! EssenceDescriptor.ContainerDuration.empty() )
    {
      assert(EssenceDescriptor.ContainerDuration.const_get() <= 0xFFFFFFFFL);
      PDesc.ContainerDuration  = static_cast<ui32_t>(EssenceDescriptor.ContainerDuration.const_get());
    }
  PDesc.StoredWidth        = EssenceDescriptor.StoredWidth;
  PDesc.StoredHeight       = EssenceDescriptor.StoredHeight;
  PDesc.AspectRatio        = EssenceDescriptor.AspectRatio;

  PDesc.Rsize   = EssenceSubDescriptor.Rsize;
  PDesc.Xsize   = EssenceSubDescriptor.Xsize;
  PDesc.Ysize   = EssenceSubDescriptor.Ysize;
  PDesc.XOsize  = EssenceSubDescriptor.XOsize;
  PDesc.YOsize  = EssenceSubDescriptor.YOsize;
  PDesc.XTsize  = EssenceSubDescriptor.XTsize;
  PDesc.YTsize  = EssenceSubDescriptor.YTsize;
  PDesc.XTOsize = EssenceSubDescriptor.XTOsize;
  PDesc.YTOsize = EssenceSubDescriptor.YTOsize;
  PDesc.Csize   = EssenceSubDescriptor.Csize;

  // PictureComponentSizing
  ui32_t tmp_size = EssenceSubDescriptor.PictureComponentSizing.const_get().Length();

  if ( tmp_size == 17 ) // ( 2 * sizeof(ui32_t) ) + 3 components * 3 byte each
    {
      memcpy(&PDesc.ImageComponents, EssenceSubDescriptor.PictureComponentSizing.const_get().RoData() + 8, tmp_size - 8);
    }
  else
    {
      DefaultLogSink().Warn("Unexpected PictureComponentSizing size: %u, should be 17.\n", tmp_size);
    }

  // CodingStyleDefault
  memset(&PDesc.CodingStyleDefault, 0, sizeof(CodingStyleDefault_t));
  memcpy(&PDesc.CodingStyleDefault,
	 EssenceSubDescriptor.CodingStyleDefault.const_get().RoData(),
	 EssenceSubDescriptor.CodingStyleDefault.const_get().Length());

  // QuantizationDefault
  memset(&PDesc.QuantizationDefault, 0, sizeof(QuantizationDefault_t));
  memcpy(&PDesc.QuantizationDefault,
	 EssenceSubDescriptor.QuantizationDefault.const_get().RoData(),
	 EssenceSubDescriptor.QuantizationDefault.const_get().Length());
  
  PDesc.QuantizationDefault.SPqcdLength = EssenceSubDescriptor.QuantizationDefault.const_get().Length() - 1;

  // Profile

  std::fill(PDesc.Profile.Pprf, PDesc.Profile.Pprf + JP2K::MaxPRFN, 0);

  if (EssenceSubDescriptor.J2KProfile.empty() ||
	  EssenceSubDescriptor.J2KProfile.const_get().size() == 0) {

	  PDesc.Profile.N = 0;

  } else {

	  PDesc.Profile.N = EssenceSubDescriptor.J2KProfile.const_get().size();

	  std::copy(EssenceSubDescriptor.J2KProfile.const_get().begin(),
		  EssenceSubDescriptor.J2KProfile.const_get().end(),
		  PDesc.Profile.Pprf);

  }

  // Corresponding profile

  std::fill(PDesc.CorrespondingProfile.Pcpf, PDesc.CorrespondingProfile.Pcpf + JP2K::MaxCPFN, 0);

  if (EssenceSubDescriptor.J2KCorrespondingProfile.empty() ||
	  EssenceSubDescriptor.J2KCorrespondingProfile.const_get().size() == 0) {

	  PDesc.CorrespondingProfile.N = 0;

  }
  else {

	  PDesc.CorrespondingProfile.N = EssenceSubDescriptor.J2KCorrespondingProfile.const_get().size();

	  std::copy(EssenceSubDescriptor.J2KCorrespondingProfile.const_get().begin(),
		  EssenceSubDescriptor.J2KCorrespondingProfile.const_get().end(),
		  PDesc.CorrespondingProfile.Pcpf);

  }

  // Extended capabilities

  std::fill(PDesc.ExtendedCapabilities.Ccap, PDesc.ExtendedCapabilities.Ccap + JP2K::MaxCapabilities, 0);

  if (EssenceSubDescriptor.J2KExtendedCapabilities.empty()) {

	  PDesc.ExtendedCapabilities.Pcap = 0;
	  PDesc.ExtendedCapabilities.N = JP2K::NoExtendedCapabilitiesSignaled;

  }
  else {

	  PDesc.ExtendedCapabilities.Pcap = EssenceSubDescriptor.J2KExtendedCapabilities.const_get().Pcap;
	  PDesc.ExtendedCapabilities.N = EssenceSubDescriptor.J2KExtendedCapabilities.const_get().Ccap.size();

	  std::copy(EssenceSubDescriptor.J2KExtendedCapabilities.const_get().Ccap.begin(),
		  EssenceSubDescriptor.J2KExtendedCapabilities.const_get().Ccap.end(),
		  PDesc.ExtendedCapabilities.Ccap);

  }

  return RESULT_OK;
}